

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

size_t mserialize::detail::
       BuiltinSerializer<std::multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
       ::sizeof_elems(long param_1)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  long lVar3;
  size_t (*__range3) [3];
  size_t sVar4;
  long local_28 [3];
  
  sVar4 = 0;
  for (p_Var1 = *(_Rb_tree_node_base **)(param_1 + 0x18);
      p_Var1 != (_Rb_tree_node_base *)(param_1 + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    local_28[0] = 0;
    local_28[1] = 4;
    local_28[2] = 1;
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar2 = lVar2 + *(long *)((long)local_28 + lVar3);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    sVar4 = sVar4 + lVar2;
  }
  return sVar4;
}

Assistant:

static std::size_t sizeof_elems(
    std::false_type /* value_type is not arithmetic */,
    const Sequence& s
  )
  {
    std::size_t result = 0;
    for (auto&& elem : s)
    {
      result += mserialize::serialized_size<value_type>(elem);
    }
    return result;
  }